

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

WaitForLineResult
cmSystemTools::WaitForLine
          (uv_loop_t *loop,uv_stream_t *outPipe,uv_stream_t *errPipe,string *line,cmDuration timeout
          ,vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  bool bVar1;
  reference pcVar2;
  _func_void_uv_timer_t_ptr *cb;
  char *pcVar3;
  size_type sVar4;
  ulong uVar5;
  rep rVar6;
  bool local_2e9;
  bool local_2c9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2c0;
  const_iterator local_2b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2b0;
  const_iterator local_2a8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2a0;
  char *local_298;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_290;
  const_iterator local_288;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_280;
  const_iterator local_278;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_270;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_268;
  char *local_260;
  size_type local_258;
  size_type size_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_230;
  char *local_228;
  size_type local_220;
  size_type size_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1f8;
  char *local_1f0;
  size_type local_1e8;
  size_type size_1;
  char *local_1d8;
  size_type local_1d0;
  size_type size;
  undefined1 local_1c0 [7];
  bool timedOut;
  uv_timer_ptr timer;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errHandle;
  ReadData errData;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outHandle;
  ReadData outData;
  anon_class_1_0_00000001 startRead;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_140;
  const_iterator local_138;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_130;
  const_iterator local_128;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_120;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_118;
  ulong local_110;
  size_type length_1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_100;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f8;
  int local_ec;
  char *local_e8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_e0;
  const_iterator local_d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  const_iterator local_c8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_a8;
  ulong local_a0;
  size_type length;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_90;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_88;
  undefined1 local_80 [8];
  string strdata;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Stack_58;
  cmProcessOutput processOutput;
  iterator erriter;
  iterator outiter;
  vector<char,_std::allocator<char>_> *err_local;
  vector<char,_std::allocator<char>_> *out_local;
  string *line_local;
  uv_stream_t *errPipe_local;
  uv_stream_t *outPipe_local;
  uv_loop_t *loop_local;
  cmDuration timeout_local;
  
  loop_local = (uv_loop_t *)timeout.__r;
  std::__cxx11::string::clear();
  erriter = std::vector<char,_std::allocator<char>_>::begin(out);
  _Stack_58._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),Auto,0x400);
  std::__cxx11::string::string((string *)local_80);
LAB_0011ca5b:
  do {
    local_88._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
    bVar1 = __gnu_cxx::operator!=(&erriter,&local_88);
    if (bVar1) {
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&erriter);
      local_2c9 = false;
      if (*pcVar2 == '\r') {
        local_90 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&erriter,1);
        length = (size_type)std::vector<char,_std::allocator<char>_>::end(out);
        local_2c9 = __gnu_cxx::operator==
                              (&local_90,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length);
      }
      if (local_2c9 == false) {
        pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&erriter);
        if ((*pcVar2 == '\n') ||
           (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&erriter), *pcVar2 == '\0')) {
          local_a8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          local_a0 = __gnu_cxx::operator-(&erriter,&local_a8);
          bVar1 = false;
          if (1 < local_a0) {
            local_b0 = __gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator-(&erriter,1);
            pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&local_b0);
            bVar1 = *pcVar2 == '\r';
          }
          if (bVar1) {
            local_a0 = local_a0 - 1;
          }
          if (local_a0 != 0) {
            pcVar3 = std::vector<char,_std::allocator<char>_>::data(out);
            std::__cxx11::string::append((char *)line,(ulong)pcVar3);
          }
          local_d0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_c8,&local_d0);
          local_e0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator+(&erriter,1);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_d8,&local_e0);
          local_e8 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_c8,local_d8);
          timeout_local.__r._4_4_ = STDOUT;
          local_ec = 1;
          goto LAB_0011d5f9;
        }
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&erriter);
        goto LAB_0011ca5b;
      }
    }
    while( true ) {
      local_f8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
      bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffa8,&local_f8);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffa8);
      local_2e9 = false;
      if (*pcVar2 == '\r') {
        local_100 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                    ::operator+(&stack0xffffffffffffffa8,1);
        length_1 = (size_type)std::vector<char,_std::allocator<char>_>::end(err);
        local_2e9 = __gnu_cxx::operator==
                              (&local_100,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_1);
      }
      if (local_2e9 != false) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffa8);
      if ((*pcVar2 == '\n') ||
         (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&stack0xffffffffffffffa8), *pcVar2 == '\0')) {
        local_118._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_110 = __gnu_cxx::operator-(&stack0xffffffffffffffa8,&local_118);
        bVar1 = false;
        if (1 < local_110) {
          local_120 = __gnu_cxx::
                      __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                      operator-(&stack0xffffffffffffffa8,1);
          pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_120);
          bVar1 = *pcVar2 == '\r';
        }
        if (bVar1) {
          local_110 = local_110 - 1;
        }
        if (local_110 != 0) {
          pcVar3 = std::vector<char,_std::allocator<char>_>::data(err);
          std::__cxx11::string::append((char *)line,(ulong)pcVar3);
        }
        local_130._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_128,&local_130);
        local_140 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                    ::operator+(&stack0xffffffffffffffa8,1);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_138,&local_140);
        std::vector<char,_std::allocator<char>_>::erase(err,local_128,local_138);
        timeout_local.__r._4_4_ = STDERR;
        local_ec = 1;
        goto LAB_0011d5f9;
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&stack0xffffffffffffffa8);
    }
    WaitForLine::ReadData::ReadData((ReadData *)&outHandle);
    WaitForLine::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&errData.Read,(uv_stream_t *)&outData.field_0x27,
               (ReadData *)outPipe);
    WaitForLine::ReadData::ReadData((ReadData *)&errHandle);
    WaitForLine::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
                super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (uv_stream_t *)&outData.field_0x27,(ReadData *)errPipe);
    cm::uv_timer_ptr::uv_timer_ptr((uv_timer_ptr *)local_1c0);
    size._7_1_ = 0;
    cm::uv_timer_ptr::init((uv_timer_ptr *)local_1c0,(EVP_PKEY_CTX *)loop);
    cb = WaitForLine(uv_loop_s*,uv_stream_s*,uv_stream_s*,std::__cxx11::string&,std::chrono::duration,std::vector&,std::vector&)
         ::$_1::operator_cast_to_function_pointer((__1 *)((long)&size + 6));
    rVar6 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                      ((duration<double,_std::ratio<1L,_1L>_> *)&loop_local);
    uVar5 = (ulong)(rVar6 * 1000.0);
    cm::uv_timer_ptr::start
              ((uv_timer_ptr *)local_1c0,cb,
               uVar5 | (long)(rVar6 * 1000.0 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f,0);
    uv_run(loop,UV_RUN_ONCE);
    if ((size._7_1_ & 1) == 0) {
      if ((outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_1_ & 1) == 0)
      {
        if ((errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_1_ & 1) == 0
           ) {
          if (((outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._17_1_ & 1)
               != 0) &&
             ((errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._17_1_ & 1) !=
              0)) {
            std::__cxx11::string::string((string *)&size_2);
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_2,
                       (string *)local_80,1);
            std::__cxx11::string::~string((string *)&size_2);
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              local_220 = std::vector<char,_std::allocator<char>_>::size(out);
              cm::
              append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80);
              local_230._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
              local_228 = (char *)__gnu_cxx::
                                  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                  ::operator+(&local_230,local_220);
              erriter._M_current = local_228;
            }
            std::__cxx11::string::string((string *)&size_3);
            cmProcessOutput::DecodeText
                      ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_3,
                       (string *)local_80,2);
            std::__cxx11::string::~string((string *)&size_3);
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              local_258 = std::vector<char,_std::allocator<char>_>::size(err);
              cm::
              append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80);
              local_268._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
              local_260 = (char *)__gnu_cxx::
                                  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                  ::operator+(&local_268,local_258);
              _Stack_58 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                          local_260;
            }
            bVar1 = std::vector<char,_std::allocator<char>_>::empty(out);
            if (bVar1) {
              bVar1 = std::vector<char,_std::allocator<char>_>::empty(err);
              if (bVar1) {
                timeout_local.__r._4_4_ = None;
                local_ec = 1;
              }
              else {
                pcVar3 = std::vector<char,_std::allocator<char>_>::data(err);
                local_2a0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
                __gnu_cxx::operator-(&stack0xffffffffffffffa8,&local_2a0);
                std::__cxx11::string::append((char *)line,(ulong)pcVar3);
                local_2b0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
                __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                           &local_2a8,&local_2b0);
                local_2c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
                __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                           &local_2b8,&local_2c0);
                std::vector<char,_std::allocator<char>_>::erase(err,local_2a8,local_2b8);
                timeout_local.__r._4_4_ = STDERR;
                local_ec = 1;
              }
            }
            else {
              pcVar3 = std::vector<char,_std::allocator<char>_>::data(out);
              local_270._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
              __gnu_cxx::operator-(&erriter,&local_270);
              std::__cxx11::string::append((char *)line,(ulong)pcVar3);
              local_280._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
              __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
              __normal_iterator<char*>
                        ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                         &local_278,&local_280);
              local_290._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
              __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
              __normal_iterator<char*>
                        ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                         &local_288,&local_290);
              local_298 = (char *)std::vector<char,_std::allocator<char>_>::erase
                                            (out,local_278,local_288);
              timeout_local.__r._4_4_ = STDOUT;
              local_ec = 1;
            }
            goto LAB_0011d56e;
          }
        }
        else {
          pcVar3 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)&errData);
          sVar4 = std::vector<char,_std::allocator<char>_>::size
                            ((vector<char,_std::allocator<char>_> *)&errData);
          cmProcessOutput::DecodeText
                    ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),pcVar3,sVar4,
                     (string *)local_80,2);
          local_1e8 = std::vector<char,_std::allocator<char>_>::size(err);
          cm::
          append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          local_1f8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          local_1f0 = (char *)__gnu_cxx::
                              __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                              operator+(&local_1f8,local_1e8);
          _Stack_58 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                      local_1f0;
        }
      }
      else {
        pcVar3 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)&outData);
        sVar4 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)&outData);
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),pcVar3,sVar4,
                   (string *)local_80,1);
        local_1d0 = std::vector<char,_std::allocator<char>_>::size(out);
        cm::
        append<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                  );
        size_1 = (size_type)std::vector<char,_std::allocator<char>_>::begin(out);
        local_1d8 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                       *)&size_1,local_1d0);
        erriter._M_current = local_1d8;
      }
      if ((outData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._17_1_ & 1) == 0)
      {
        uv_read_stop(outPipe);
      }
      if ((errData.Buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._17_1_ & 1) == 0)
      {
        uv_read_stop(errPipe);
      }
      local_ec = 0;
    }
    else {
      timeout_local.__r._4_4_ = Timeout;
      local_ec = 1;
    }
LAB_0011d56e:
    cm::uv_timer_ptr::~uv_timer_ptr((uv_timer_ptr *)local_1c0);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               &timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
                super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    WaitForLine::ReadData::~ReadData((ReadData *)&errHandle);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
               &errData.Read);
    WaitForLine::ReadData::~ReadData((ReadData *)&outHandle);
    if (local_ec != 0) {
LAB_0011d5f9:
      std::__cxx11::string::~string((string *)local_80);
      return timeout_local.__r._4_4_;
    }
  } while( true );
}

Assistant:

cmSystemTools::WaitForLineResult cmSystemTools::WaitForLine(
  uv_loop_t* loop, uv_stream_t* outPipe, uv_stream_t* errPipe,
  std::string& line, cmDuration timeout, std::vector<char>& out,
  std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return WaitForLineResult::STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return WaitForLineResult::STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    struct ReadData
    {
      uv_stream_t* Stream;
      std::vector<char> Buffer;
      bool Read = false;
      bool Finished = false;
    };
    auto startRead =
      [](uv_stream_t* stream,
         ReadData& data) -> std::unique_ptr<cmUVStreamReadHandle> {
      data.Stream = stream;
      return cmUVStreamRead(
        stream,
        [&data](std::vector<char> buf) {
          data.Buffer = std::move(buf);
          data.Read = true;
          uv_read_stop(data.Stream);
        },
        [&data]() { data.Finished = true; });
    };
    ReadData outData;
    auto outHandle = startRead(outPipe, outData);
    ReadData errData;
    auto errHandle = startRead(errPipe, errData);

    cm::uv_timer_ptr timer;
    bool timedOut = false;
    timer.init(*loop, &timedOut);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timedOutPtr = static_cast<bool*>(handle->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);

    uv_run(loop, UV_RUN_ONCE);
    if (timedOut) {
      // Timeout has been exceeded.
      return WaitForLineResult::Timeout;
    }
    if (outData.Read) {
      processOutput.DecodeText(outData.Buffer.data(), outData.Buffer.size(),
                               strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (errData.Read) {
      processOutput.DecodeText(errData.Buffer.data(), errData.Buffer.size(),
                               strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (outData.Finished && errData.Finished) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return WaitForLineResult::STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return WaitForLineResult::STDERR;
      }
      return WaitForLineResult::None;
    }
    if (!outData.Finished) {
      uv_read_stop(outPipe);
    }
    if (!errData.Finished) {
      uv_read_stop(errPipe);
    }
  }
}